

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingMesh::~IfcReinforcingMesh(IfcReinforcingMesh *this)

{
  IfcElement *this_00;
  
  this_00 = (IfcElement *)
            &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.field_0x78;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x78 = 0x8c4918;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x60 = 0x8c4a58;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x8c4940;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x110 = 0x8c4968;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x148 = 0x8c4990;
  *(undefined8 *)&this[-1].super_IfcReinforcingElement.field_0x178 = 0x8c49b8;
  this[-1].MeshWidth.ptr = 4.54241583271342e-317;
  this[-1].LongitudinalBarNominalDiameter = 4.54243559533925e-317;
  this[-1].LongitudinalBarCrossSectionArea = 4.54245535796509e-317;
  if ((undefined1 *)this[-1].LongitudinalBarSpacing != &this[-1].field_0x1f0) {
    operator_delete((undefined1 *)this[-1].LongitudinalBarSpacing,*(long *)&this[-1].field_0x1f0 + 1
                   );
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__008c46e0);
  operator_delete(this_00,0x208);
  return;
}

Assistant:

IfcReinforcingMesh() : Object("IfcReinforcingMesh") {}